

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O0

int util::variant::int_length(int x)

{
  undefined4 local_14;
  undefined4 local_10;
  int count;
  int x_local;
  
  if (x == 0) {
    count = 1;
  }
  else {
    local_10 = x;
    if (x < 0) {
      local_10 = -x;
    }
    local_14 = (uint)(x < 0);
    if (local_10 < 0) {
      count = 1;
    }
    else {
      for (; 0 < local_10; local_10 = local_10 / 10) {
        local_14 = local_14 + 1;
      }
      count = local_14;
    }
  }
  return count;
}

Assistant:

int variant::int_length(int x)
{
	int count = 0;

	if (x == 0)
		return 1;

	if (x < 0)
	{
		x = -x;
		++count;
	}

	if (x < 0)
	{
		return 1;
	}

	while (x > 0)
	{
		x /= 10;
		++count;
	}

	return count;
}